

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Module *module,Orphanage orphanage)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *this_00;
  CompiledModule *this_01;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  this_01 = Impl::addInternal((this->impl).value.ptr,module);
  CompiledModule::getFileImportTable(__return_storage_ptr__,this_01,orphanage);
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::getFileImportTable(Module& module, Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getFileImportTable(module, orphanage);
}